

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  int iVar1;
  stbi_uc *psVar2;
  undefined8 *puVar3;
  byte *pbVar4;
  byte bVar5;
  stbi_uc *psVar6;
  byte *pbVar7;
  uint uVar8;
  
  psVar6 = s->img_buffer;
  if (s->img_buffer_end <= psVar6) {
    if (s->read_from_callbacks == 0) goto LAB_00132b25;
    stbi__refill_buffer(s);
    psVar6 = s->img_buffer;
  }
  psVar2 = psVar6 + 1;
  s->img_buffer = psVar2;
  if (*psVar6 != 'G') {
LAB_00132b25:
    puVar3 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
    *puVar3 = "not GIF";
    return 0;
  }
  if (s->img_buffer_end <= psVar2) {
    if (s->read_from_callbacks == 0) goto LAB_00132b25;
    stbi__refill_buffer(s);
    psVar2 = s->img_buffer;
  }
  psVar6 = psVar2 + 1;
  s->img_buffer = psVar6;
  if (*psVar2 != 'I') goto LAB_00132b25;
  if (s->img_buffer_end <= psVar6) {
    if (s->read_from_callbacks == 0) goto LAB_00132b25;
    stbi__refill_buffer(s);
    psVar6 = s->img_buffer;
  }
  psVar2 = psVar6 + 1;
  s->img_buffer = psVar2;
  if (*psVar6 != 'F') goto LAB_00132b25;
  if (s->img_buffer_end <= psVar2) {
    if (s->read_from_callbacks == 0) goto LAB_00132b25;
    stbi__refill_buffer(s);
    psVar2 = s->img_buffer;
  }
  psVar6 = psVar2 + 1;
  s->img_buffer = psVar6;
  if (*psVar2 != '8') goto LAB_00132b25;
  if (s->img_buffer_end <= psVar6) {
    if (s->read_from_callbacks == 0) goto LAB_00132b25;
    stbi__refill_buffer(s);
    psVar6 = s->img_buffer;
  }
  psVar2 = psVar6 + 1;
  s->img_buffer = psVar2;
  if ((*psVar6 != '7') && (*psVar6 != '9')) goto LAB_00132b25;
  if (s->img_buffer_end <= psVar2) {
    if (s->read_from_callbacks == 0) goto LAB_00132b25;
    stbi__refill_buffer(s);
    psVar2 = s->img_buffer;
  }
  s->img_buffer = psVar2 + 1;
  if (*psVar2 != 'a') goto LAB_00132b25;
  puVar3 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
  *puVar3 = "";
  iVar1 = stbi__get16le(s);
  g->w = iVar1;
  iVar1 = stbi__get16le(s);
  g->h = iVar1;
  pbVar4 = s->img_buffer;
  pbVar7 = s->img_buffer_end;
  if (pbVar4 < pbVar7) {
LAB_00132a7b:
    s->img_buffer = pbVar4 + 1;
    uVar8 = (uint)*pbVar4;
    pbVar4 = pbVar4 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar4 = s->img_buffer;
      pbVar7 = s->img_buffer_end;
      goto LAB_00132a7b;
    }
    uVar8 = 0;
  }
  g->flags = uVar8;
  if (pbVar4 < pbVar7) {
LAB_00132ab5:
    s->img_buffer = pbVar4 + 1;
    uVar8 = (uint)*pbVar4;
    pbVar4 = pbVar4 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar4 = s->img_buffer;
      pbVar7 = s->img_buffer_end;
      goto LAB_00132ab5;
    }
    uVar8 = 0;
  }
  g->bgindex = uVar8;
  if (pbVar7 <= pbVar4) {
    if (s->read_from_callbacks == 0) {
      uVar8 = 0;
      goto LAB_00132af6;
    }
    stbi__refill_buffer(s);
    pbVar4 = s->img_buffer;
  }
  s->img_buffer = pbVar4 + 1;
  uVar8 = (uint)*pbVar4;
LAB_00132af6:
  g->ratio = uVar8;
  g->transparent = -1;
  if ((0x1000000 < g->w) || (0x1000000 < g->h)) {
    *puVar3 = "too large";
    return 0;
  }
  if (comp != (int *)0x0) {
    *comp = 4;
  }
  if (is_info == 0) {
    bVar5 = (byte)g->flags;
    if ((char)bVar5 < '\0') {
      stbi__gif_parse_colortable(s,g->pal,2 << (bVar5 & 7),-1);
      return 1;
    }
    return 1;
  }
  return 1;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (g->w > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (g->h > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}